

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cc
# Opt level: O0

void __thiscall raptor::Connection::Shutdown(Connection *this,bool notify)

{
  bool notify_local;
  Connection *this_local;
  
  if (-1 < this->_fd) {
    SendRecvThread::Delete(this->_rcv_thd,this->_fd,0x80000001);
    SendRecvThread::Delete(this->_snd_thd,this->_fd,0x80000004);
    if (notify) {
      (*this->_service->_vptr_INotificationTransfer[4])();
    }
    raptor_set_socket_shutdown(this->_fd);
    this->_fd = -1;
    memset(&this->_addr,0,0x84);
    ReleaseBuffer(this);
    this->_user_data = 0;
    this->_extend_ptr = (void *)0x0;
  }
  return;
}

Assistant:

void Connection::Shutdown(bool notify) {
    if (_fd < 0) {
        return;
    }

    _rcv_thd->Delete(_fd, EPOLLIN | EPOLLET);
    _snd_thd->Delete(_fd, EPOLLOUT | EPOLLET);

    if (notify) {
        _service->OnConnectionClosed(_cid);
    }

    raptor_set_socket_shutdown(_fd);
    _fd = -1;

    memset(&_addr, 0, sizeof(_addr));

    ReleaseBuffer();

    _user_data = 0;
    _extend_ptr = nullptr;
}